

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

void __thiscall QTimeZonePrivate::serialize(QTimeZonePrivate *this,QDataStream *ds)

{
  long lVar1;
  QByteArray *in_RSI;
  long in_FS_OFFSET;
  QString *in_stack_00000010;
  QDataStream *in_stack_00000018;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::fromUtf8<void>(in_RSI);
  ::operator<<(in_stack_00000018,in_stack_00000010);
  QString::~QString((QString *)0x73ab4d);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimeZonePrivate::serialize(QDataStream &ds) const
{
    ds << QString::fromUtf8(m_id);
}